

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_source_element(JSParseState *s)

{
  uint uVar1;
  JSFunctionDef *pJVar2;
  JSContext *pJVar3;
  JSModuleDef *pJVar4;
  JSAtomStruct *pJVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  JSAtom JVar12;
  JSAtom JVar13;
  ulong uVar14;
  JSExportEntry *pJVar15;
  long lVar16;
  int *piVar17;
  JSParseExportEnum export_flag;
  long lVar18;
  char *pcVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint8_t *p;
  JSFunctionDef **in_stack_ffffffffffffffa0;
  uint8_t *local_50;
  long local_48;
  JSContext *local_40;
  ulong local_38;
  
  iVar9 = (s->token).val;
  if (iVar9 == -0x3b) {
LAB_0015423f:
    iVar9 = js_parse_function_decl2
                      (s,JS_PARSE_FUNC_STATEMENT,JS_FUNC_NORMAL,(JSAtom)(s->token).ptr,
                       (uint8_t *)(ulong)(uint)(s->token).line_num,0,JS_PARSE_EXPORT_NONE,
                       in_stack_ffffffffffffffa0);
    goto LAB_00154313;
  }
  pJVar2 = s->cur_func;
  if (((iVar9 == -0x7d) && ((s->token).u.ident.atom == 0x85)) &&
     ((s->token).u.ident.has_escape == 0)) {
    local_50 = s->buf_ptr;
    iVar9 = simple_next_token(&local_50,1);
    if (iVar9 == -0x3b) goto LAB_0015423f;
  }
  iVar9 = (s->token).val;
  if (iVar9 == -0x33) {
    if (pJVar2->module != (JSModuleDef *)0x0) {
      local_50 = s->buf_ptr;
      iVar9 = simple_next_token(&local_50,0);
      if ((iVar9 != 0x28) && (iVar9 != 0x2e)) {
        pJVar3 = s->ctx;
        pJVar4 = s->cur_func->module;
        iVar9 = next_token(s);
        if (iVar9 != 0) {
          return -1;
        }
        iVar9 = pJVar4->import_entries_count;
        iVar10 = (s->token).val;
        if (iVar10 == -0x7d) {
          if ((s->token).u.ident.is_reserved != 0) {
            js_parse_error_reserved_identifier(s);
            return -1;
          }
          JVar12 = (s->token).u.ident.atom;
          if (0xd1 < (long)(int)JVar12) {
            pJVar5 = pJVar3->rt->atom_array[(int)JVar12];
            (pJVar5->header).ref_count = (pJVar5->header).ref_count + 1;
          }
          iVar10 = next_token(s);
          JVar13 = 0x16;
          if (iVar10 == 0) {
            JVar13 = 0x16;
            iVar10 = add_import(s,pJVar4,JVar12,0x16);
            if (iVar10 == 0) {
              JS_FreeAtom(pJVar3,JVar12);
              if ((s->token).val == 0x2c) {
                iVar10 = next_token(s);
                if (iVar10 != 0) {
                  return -1;
                }
                goto LAB_001547f3;
              }
              goto LAB_00154aad;
            }
          }
LAB_00154621:
          JS_FreeAtom(pJVar3,JVar12);
LAB_00154631:
          JS_FreeAtom(pJVar3,JVar13);
          return -1;
        }
        if (iVar10 == -0x7f) {
          JVar13 = JS_ValueToAtom(pJVar3,(s->token).u.str.str);
          if (JVar13 == 0) {
            return -1;
          }
          iVar10 = next_token(s);
          if (iVar10 != 0) goto LAB_00154631;
        }
        else {
LAB_001547f3:
          iVar10 = (s->token).val;
          if (iVar10 == 0x7b) {
            do {
              iVar10 = next_token(s);
              if (iVar10 != 0) {
                return -1;
              }
              iVar10 = (s->token).val;
              if (iVar10 == 0x7d) break;
              if (iVar10 + 0x27U < 0xffffffd2 && iVar10 != -0x7d) goto LAB_00154c60;
              JVar13 = (s->token).u.ident.atom;
              lVar18 = (long)(int)JVar13;
              if (0xd1 < lVar18) {
                pJVar5 = pJVar3->rt->atom_array[lVar18];
                (pJVar5->header).ref_count = (pJVar5->header).ref_count + 1;
              }
              iVar10 = next_token(s);
              JVar12 = 0;
              if (iVar10 != 0) goto LAB_00154621;
              if ((((s->token).val == -0x7d) && ((s->token).u.ident.atom == 0x79)) &&
                 ((s->token).u.ident.has_escape == 0)) {
                iVar10 = next_token(s);
                if (iVar10 != 0) goto LAB_00154621;
                iVar10 = (s->token).val;
                if (iVar10 + 0x27U < 0xffffffd2 && iVar10 != -0x7d) {
                  JVar12 = 0;
                  js_parse_error(s,"identifier expected");
                  goto LAB_00154621;
                }
                JVar12 = (s->token).u.ident.atom;
                if (0xd1 < (long)(int)JVar12) {
                  pJVar5 = pJVar3->rt->atom_array[(int)JVar12];
                  (pJVar5->header).ref_count = (pJVar5->header).ref_count + 1;
                }
                iVar10 = next_token(s);
                if (iVar10 != 0) goto LAB_00154621;
              }
              else {
                JVar12 = JVar13;
                if (0xd1 < (int)JVar13) {
                  pJVar5 = pJVar3->rt->atom_array[lVar18];
                  (pJVar5->header).ref_count = (pJVar5->header).ref_count + 1;
                }
              }
              iVar10 = add_import(s,pJVar4,JVar12,JVar13);
              if (iVar10 != 0) goto LAB_00154621;
              JS_FreeAtom(pJVar3,JVar12);
              JS_FreeAtom(pJVar3,JVar13);
            } while ((s->token).val == 0x2c);
            iVar10 = js_parse_expect(s,0x7d);
            if (iVar10 != 0) {
              return -1;
            }
          }
          else if (iVar10 == 0x2a) {
            iVar10 = next_token(s);
            if (iVar10 != 0) {
              return -1;
            }
            if ((((s->token).val != -0x7d) || ((s->token).u.ident.atom != 0x79)) ||
               ((s->token).u.ident.has_escape != 0)) {
              pcVar19 = "expecting \'as\'";
LAB_0015483e:
              js_parse_error(s,pcVar19);
              return -1;
            }
            iVar10 = next_token(s);
            if (iVar10 != 0) {
              return -1;
            }
            iVar10 = (s->token).val;
            if (iVar10 + 0x27U < 0xffffffd2 && iVar10 != -0x7d) {
LAB_00154c60:
              pcVar19 = "identifier expected";
              goto LAB_0015483e;
            }
            JVar12 = (s->token).u.ident.atom;
            if (0xd1 < (long)(int)JVar12) {
              pJVar5 = pJVar3->rt->atom_array[(int)JVar12];
              (pJVar5->header).ref_count = (pJVar5->header).ref_count + 1;
            }
            iVar10 = next_token(s);
            JVar13 = 0x7d;
            if (iVar10 == 0) {
              JVar13 = 0x7d;
              iVar10 = add_import(s,pJVar4,JVar12,0x7d);
              if (iVar10 == 0) {
                JS_FreeAtom(pJVar3,JVar12);
                goto LAB_00154aad;
              }
            }
            goto LAB_00154621;
          }
LAB_00154aad:
          JVar13 = js_parse_from_clause(s);
          if (JVar13 == 0) {
            return -1;
          }
        }
        iVar10 = add_req_module_entry(pJVar3,pJVar4,JVar13);
        JS_FreeAtom(pJVar3,JVar13);
        auVar8 = _DAT_00193420;
        auVar7 = _DAT_00177030;
        auVar6 = _DAT_00177020;
        if (iVar10 < 0) {
          return -1;
        }
        if (iVar9 < pJVar4->import_entries_count) {
          lVar18 = (long)pJVar4->import_entries_count - (long)iVar9;
          lVar16 = lVar18 + -1;
          auVar20._8_4_ = (int)lVar16;
          auVar20._0_8_ = lVar16;
          auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
          piVar17 = &pJVar4->import_entries[(long)iVar9 + 3].req_module_idx;
          uVar14 = 0;
          auVar20 = auVar20 ^ _DAT_00177030;
          do {
            auVar21._8_4_ = (int)uVar14;
            auVar21._0_8_ = uVar14;
            auVar21._12_4_ = (int)(uVar14 >> 0x20);
            auVar22 = (auVar21 | auVar6) ^ auVar7;
            iVar9 = auVar20._4_4_;
            if ((bool)(~(auVar22._4_4_ == iVar9 && auVar20._0_4_ < auVar22._0_4_ ||
                        iVar9 < auVar22._4_4_) & 1)) {
              piVar17[-9] = iVar10;
            }
            if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
                auVar22._12_4_ <= auVar20._12_4_) {
              piVar17[-6] = iVar10;
            }
            auVar21 = (auVar21 | auVar8) ^ auVar7;
            iVar11 = auVar21._4_4_;
            if (iVar11 <= iVar9 && (iVar11 != iVar9 || auVar21._0_4_ <= auVar20._0_4_)) {
              piVar17[-3] = iVar10;
              *piVar17 = iVar10;
            }
            uVar14 = uVar14 + 4;
            piVar17 = piVar17 + 0xc;
          } while ((lVar18 + 3U & 0xfffffffffffffffc) != uVar14);
        }
        goto LAB_00154bee;
      }
    }
  }
  else if ((iVar9 == -0x35) && (pJVar2->module != (JSModuleDef *)0x0)) {
    pJVar3 = s->ctx;
    pJVar4 = s->cur_func->module;
    iVar10 = next_token(s);
    iVar9 = -1;
    if (iVar10 != 0) goto LAB_00154313;
    iVar10 = (s->token).val;
    if (iVar10 != -0x7d) {
      if (iVar10 != -0x3b) {
        if (iVar10 != -0x38) goto LAB_001543ee;
        export_flag = JS_PARSE_EXPORT_NAMED;
LAB_001542ce:
        iVar9 = js_parse_class(s,0,export_flag);
        goto LAB_00154313;
      }
LAB_001543c7:
      JVar12 = (JSAtom)(s->token).ptr;
      uVar1 = (s->token).line_num;
      iVar9 = 1;
LAB_001543e4:
      iVar9 = js_parse_function_decl2
                        (s,JS_PARSE_FUNC_STATEMENT,JS_FUNC_NORMAL,JVar12,(uint8_t *)(ulong)uVar1,
                         iVar9,JS_PARSE_EXPORT_NONE,in_stack_ffffffffffffffa0);
      goto LAB_00154313;
    }
    if (((s->token).u.ident.atom == 0x85) && ((s->token).u.ident.has_escape == 0)) {
      local_50 = s->buf_ptr;
      iVar9 = simple_next_token(&local_50,1);
      if (iVar9 == -0x3b) goto LAB_001543c7;
    }
LAB_001543ee:
    iVar11 = next_token(s);
    iVar9 = -1;
    if (iVar11 != 0) goto LAB_00154313;
    if (iVar10 < -0x2f) {
      if (iVar10 != -0x4f) {
        if (iVar10 == -0x40) {
          iVar9 = (s->token).val;
          if (iVar9 == -0x7d) {
            if (((s->token).u.ident.atom == 0x85) && ((s->token).u.ident.has_escape == 0)) {
              local_50 = s->buf_ptr;
              iVar9 = simple_next_token(&local_50,1);
              if (iVar9 == -0x3b) goto LAB_001549a5;
            }
          }
          else {
            if (iVar9 == -0x3b) {
LAB_001549a5:
              JVar12 = (JSAtom)(s->token).ptr;
              uVar1 = (s->token).line_num;
              iVar9 = 2;
              goto LAB_001543e4;
            }
            if (iVar9 == -0x38) {
              export_flag = JS_PARSE_EXPORT_DEFAULT;
              goto LAB_001542ce;
            }
          }
          iVar10 = js_parse_assign_expr2(s,1);
          iVar9 = -1;
          if (iVar10 != 0) goto LAB_00154313;
          set_object_name(s,0x16);
          iVar10 = define_var(s,s->cur_func,0x7c,JS_VAR_DEF_LET);
          iVar9 = -1;
          if (iVar10 < 0) goto LAB_00154313;
          emit_op(s,0xbb);
          local_50 = (uint8_t *)CONCAT44(local_50._4_4_,0x7c);
          dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_50,4);
          local_50 = (uint8_t *)((ulong)local_50 & 0xffffffffffff0000);
          dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_50,2);
          pJVar15 = add_export_entry2(s->ctx,s,pJVar4,0x7c,0x16,JS_EXPORT_TYPE_LOCAL);
          iVar9 = -1;
          if (pJVar15 == (JSExportEntry *)0x0) goto LAB_00154313;
LAB_00154bee:
          iVar9 = js_parse_expect_semi(s);
          goto LAB_00154313;
        }
        if (iVar10 != -0x37) {
LAB_0015463b:
          pcVar19 = "invalid export syntax";
LAB_00154642:
          js_parse_error(s,pcVar19);
          goto LAB_0015464c;
        }
      }
    }
    else if (iVar10 != -0x2f) {
      if (iVar10 == 0x2a) {
        if ((((s->token).val != -0x7d) || ((s->token).u.ident.atom != 0x79)) ||
           ((s->token).u.ident.has_escape != 0)) {
          JVar12 = js_parse_from_clause(s);
          iVar9 = -1;
          if (JVar12 == 0) goto LAB_00154313;
          iVar10 = add_req_module_entry(pJVar3,pJVar4,JVar12);
          JS_FreeAtom(pJVar3,JVar12);
          iVar9 = -1;
          if (iVar10 < 0) goto LAB_00154313;
          iVar10 = add_star_export_entry(pJVar3,pJVar4,iVar10);
          iVar9 = -1;
          if (iVar10 < 0) goto LAB_00154313;
          goto LAB_00154bee;
        }
        iVar10 = next_token(s);
        iVar9 = -1;
        if (iVar10 != 0) goto LAB_00154313;
        iVar9 = (s->token).val;
        if (iVar9 + 0x27U < 0xffffffd2 && iVar9 != -0x7d) {
LAB_00154c29:
          pcVar19 = "identifier expected";
          goto LAB_00154642;
        }
        JVar12 = (s->token).u.ident.atom;
        if (0xd1 < (long)(int)JVar12) {
          pJVar5 = pJVar3->rt->atom_array[(int)JVar12];
          (pJVar5->header).ref_count = (pJVar5->header).ref_count + 1;
        }
        iVar9 = next_token(s);
        if ((iVar9 == 0) && (JVar13 = js_parse_from_clause(s), JVar13 != 0)) {
          local_40 = pJVar3;
          iVar10 = add_req_module_entry(pJVar3,pJVar4,JVar13);
          JS_FreeAtom(local_40,JVar13);
          if (-1 < iVar10) {
            pJVar15 = add_export_entry2(s->ctx,s,pJVar4,0x7d,JVar12,JS_EXPORT_TYPE_INDIRECT);
            JS_FreeAtom(pJVar3,JVar12);
            iVar9 = -1;
            if (pJVar15 == (JSExportEntry *)0x0) goto LAB_00154313;
            (pJVar15->u).local.var_idx = iVar10;
            goto LAB_00154bee;
          }
        }
LAB_00154d39:
        JS_FreeAtom(pJVar3,JVar12);
      }
      else {
        if (iVar10 != 0x7b) goto LAB_0015463b;
        local_48 = (long)pJVar4->export_entries_count;
        do {
          iVar9 = (s->token).val;
          if (iVar9 == 0x7d) {
LAB_001546fe:
            iVar10 = js_parse_expect(s,0x7d);
            iVar9 = -1;
            if (iVar10 != 0) goto LAB_00154313;
            if ((((s->token).val != -0x7d) || ((s->token).u.ident.atom != 0x7a)) ||
               ((s->token).u.ident.has_escape != 0)) goto LAB_00154bee;
            JVar12 = js_parse_from_clause(s);
            iVar9 = -1;
            if (JVar12 == 0) goto LAB_00154313;
            iVar10 = add_req_module_entry(pJVar3,pJVar4,JVar12);
            JS_FreeAtom(pJVar3,JVar12);
            iVar9 = -1;
            if (iVar10 < 0) goto LAB_00154313;
            if ((int)local_48 < pJVar4->export_entries_count) {
              uVar14 = local_48 << 5 | 0x10;
              do {
                pJVar15 = pJVar4->export_entries;
                *(undefined4 *)((long)&pJVar15->u + uVar14) = 1;
                *(int *)((long)pJVar15 + (uVar14 - 0x10)) = iVar10;
                local_48 = local_48 + 1;
                uVar14 = uVar14 + 0x20;
              } while (local_48 < pJVar4->export_entries_count);
            }
            goto LAB_00154bee;
          }
          if (iVar9 + 0x27U < 0xffffffd2 && iVar9 != -0x7d) goto LAB_00154c29;
          uVar1 = (s->token).u.ident.atom;
          lVar18 = (long)(int)uVar1;
          if (0xd1 < lVar18) {
            pJVar5 = pJVar3->rt->atom_array[lVar18];
            (pJVar5->header).ref_count = (pJVar5->header).ref_count + 1;
          }
          iVar9 = next_token(s);
          JVar12 = 0;
          if (iVar9 != 0) {
LAB_00154d2c:
            JS_FreeAtom(pJVar3,uVar1);
            goto LAB_00154d39;
          }
          if ((((s->token).val == -0x7d) && ((s->token).u.ident.atom == 0x79)) &&
             ((s->token).u.ident.has_escape == 0)) {
            iVar9 = next_token(s);
            JVar12 = 0;
            if (iVar9 == 0) {
              iVar9 = (s->token).val;
              if (iVar9 + 0x27U < 0xffffffd2 && iVar9 != -0x7d) {
                js_parse_error(s,"identifier expected");
                JVar12 = 0;
              }
              else {
                JVar12 = (s->token).u.ident.atom;
                uVar14 = (ulong)(int)JVar12;
                if (0xd1 < (long)uVar14) {
                  pJVar5 = pJVar3->rt->atom_array[uVar14];
                  (pJVar5->header).ref_count = (pJVar5->header).ref_count + 1;
                }
                iVar9 = next_token(s);
                if (iVar9 == 0) goto LAB_001544ee;
              }
            }
            goto LAB_00154d2c;
          }
          uVar14 = (ulong)uVar1;
          if (0xd1 < (int)uVar1) {
            pJVar5 = pJVar3->rt->atom_array[lVar18];
            (pJVar5->header).ref_count = (pJVar5->header).ref_count + 1;
            uVar14 = (ulong)uVar1;
          }
LAB_001544ee:
          local_38 = uVar14;
          pJVar15 = add_export_entry2(s->ctx,s,pJVar4,uVar1,(JSAtom)uVar14,JS_EXPORT_TYPE_LOCAL);
          JS_FreeAtom(pJVar3,uVar1);
          JS_FreeAtom(pJVar3,(JSAtom)local_38);
          if (pJVar15 == (JSExportEntry *)0x0) break;
          if ((s->token).val != 0x2c) goto LAB_001546fe;
          iVar9 = next_token(s);
        } while (iVar9 == 0);
      }
LAB_0015464c:
      iVar9 = -1;
      goto LAB_00154313;
    }
    iVar9 = js_parse_var(s,1,iVar10,1);
    goto LAB_00154313;
  }
  iVar9 = js_parse_statement_or_decl(s,7);
LAB_00154313:
  iVar10 = -1;
  if (iVar9 == 0) {
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

static __exception int js_parse_source_element(JSParseState *s)
{
    JSFunctionDef *fd = s->cur_func;
    int tok;
    
    if (s->token.val == TOK_FUNCTION ||
        (token_is_pseudo_keyword(s, JS_ATOM_async) &&
         peek_token(s, TRUE) == TOK_FUNCTION)) {
        if (js_parse_function_decl(s, JS_PARSE_FUNC_STATEMENT,
                                   JS_FUNC_NORMAL, JS_ATOM_NULL,
                                   s->token.ptr, s->token.line_num))
            return -1;
    } else if (s->token.val == TOK_EXPORT && fd->module) {
        if (js_parse_export(s))
            return -1;
    } else if (s->token.val == TOK_IMPORT && fd->module &&
               ((tok = peek_token(s, FALSE)) != '(' && tok != '.'))  {
        /* the peek_token is needed to avoid confusion with ImportCall
           (dynamic import) or import.meta */
        if (js_parse_import(s))
            return -1;
    } else {
        if (js_parse_statement_or_decl(s, DECL_MASK_ALL))
            return -1;
    }
    return 0;
}